

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::json::Value::Field::Reader>::setCapacity
          (Vector<capnp::json::Value::Field::Reader> *this,size_t newSize)

{
  Reader *pRVar1;
  Reader *__dest;
  size_t __n;
  ArrayBuilder<capnp::json::Value::Field::Reader> local_38;
  
  pRVar1 = (this->builder).ptr;
  if (newSize < (ulong)(((long)(this->builder).pos - (long)pRVar1) / 0x30)) {
    (this->builder).pos = pRVar1 + newSize;
  }
  __dest = kj::_::HeapArrayDisposer::allocateUninitialized<capnp::json::Value::Field::Reader>
                     (newSize);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pRVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pRVar1;
  local_38.ptr = __dest;
  if (__n != 0) {
    memcpy(__dest,pRVar1,__n);
  }
  local_38.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)((long)__dest + __n);
  ArrayBuilder<capnp::json::Value::Field::Reader>::operator=(&this->builder,&local_38);
  ArrayBuilder<capnp::json::Value::Field::Reader>::dispose(&local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }